

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void luaC_barrier_(lua_State *L,GCObject *o,GCObject *v)

{
  global_State *g;
  
  g = L->l_G;
  if (g->gcstate < 2) {
    reallymarkobject(g,v);
    return;
  }
  o->marked = g->currentwhite & 3 | o->marked & 0xf8;
  return;
}

Assistant:

void luaC_barrier_(lua_State *L, GCObject *o, GCObject *v) {
    global_State *g = G(L);
    lua_assert(isblack(o) && iswhite(v) && !isdead(g, v) && !isdead(g, o));
    if (keepinvariant(g))  /* must keep invariant? */
        reallymarkobject(g, v);  /* restore invariant */
    else {  /* sweep phase */
        lua_assert(issweepphase(g));
        makewhite(g, o);  /* mark main obj. as white to avoid other barriers */
    }
}